

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes,cmGeneratorTarget *target,string *lang,bool forceFullPaths,bool forResponseFile,
          string *config)

{
  cmMakefile *pcVar1;
  size_type sVar2;
  pointer pcVar3;
  byte bVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ostream *poVar11;
  pointer dir;
  char *pcVar12;
  char *pcVar13;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar14;
  string includePath;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string flagVar;
  string sysFwSearchFlagVar;
  string fwSearchFlagVar;
  string sysFlagVar;
  ostringstream includeFlags;
  char *local_2e0;
  string local_298;
  undefined1 local_278 [32];
  _Base_ptr local_258;
  size_t local_250;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  if (lang->_M_string_length == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_1a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__cxx11::string::string((string *)&local_248,"CMAKE_INCLUDE_FLAG_",(allocator *)local_278);
    std::__cxx11::string::append((string *)&local_248);
    pcVar6 = cmMakefile::GetSafeDefinition(this->Makefile,&local_248);
    std::__cxx11::string::assign((char *)&local_248);
    std::__cxx11::string::append((string *)&local_248);
    pcVar7 = cmMakefile::GetDefinition(this->Makefile,&local_248);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)local_278,"CMAKE_QUOTE_INCLUDE_PATHS",(allocator *)&local_1e8);
    pcVar8 = cmMakefile::GetDefinition(pcVar1,(string *)local_278);
    std::__cxx11::string::~string((string *)local_278);
    pcVar13 = " ";
    if (pcVar7 != (char *)0x0) {
      pcVar13 = pcVar7;
    }
    std::__cxx11::string::string
              ((string *)&local_1e8,"CMAKE_INCLUDE_SYSTEM_FLAG_",(allocator *)local_278);
    std::__cxx11::string::append((string *)&local_1e8);
    if (pcVar7 == (char *)0x0) {
      local_2e0 = cmMakefile::GetDefinition(this->Makefile,&local_1e8);
    }
    else {
      local_2e0 = (char *)0x0;
    }
    std::__cxx11::string::string((string *)&local_208,"CMAKE_",(allocator *)local_278);
    std::__cxx11::string::append((string *)&local_208);
    std::__cxx11::string::append((char *)&local_208);
    pcVar9 = cmMakefile::GetDefinition(this->Makefile,&local_208);
    std::__cxx11::string::string((string *)&local_228,"CMAKE_",(allocator *)local_278);
    std::__cxx11::string::append((string *)&local_228);
    std::__cxx11::string::append((char *)&local_228);
    pcVar10 = cmMakefile::GetDefinition(this->Makefile,&local_228);
    local_278._24_8_ = local_278 + 8;
    local_278._8_4_ = _S_red;
    local_278._16_8_ = 0;
    local_250 = 0;
    bVar4 = 0;
    local_258 = (_Base_ptr)local_278._24_8_;
    for (dir = (includes->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
        dir != (includes->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish; dir = dir + 1) {
      if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
LAB_003a4738:
        if (!(bool)(bVar4 & pcVar7 != (char *)0x0)) {
          if (local_2e0 != (char *)0x0 && target != (cmGeneratorTarget *)0x0) {
            bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(target,dir,config);
            if (bVar5) {
              std::operator<<(&local_1a8,local_2e0);
              goto LAB_003a478f;
            }
          }
          std::operator<<(&local_1a8,pcVar6);
        }
LAB_003a478f:
        (*this->_vptr_cmLocalGenerator[9])
                  (&local_298,this,dir,(ulong)((uint)forResponseFile * 2),(ulong)forceFullPaths);
        if (((pcVar8 != (char *)0x0) && (local_298._M_string_length != 0)) &&
           (*local_298._M_dataplus._M_p != '\"')) {
          std::operator<<(&local_1a8,"\"");
        }
        std::operator<<(&local_1a8,(string *)&local_298);
        if (((pcVar8 != (char *)0x0) && (local_298._M_string_length != 0)) &&
           (*local_298._M_dataplus._M_p != '\"')) {
          std::operator<<(&local_1a8,"\"");
        }
        std::operator<<(&local_1a8,pcVar13);
        std::__cxx11::string::~string((string *)&local_298);
        bVar4 = 1;
      }
      else {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string((string *)&local_298,"APPLE",(allocator *)&local_1c8);
        bVar5 = cmMakefile::IsOn(pcVar1,&local_298);
        if (!bVar5) {
          std::__cxx11::string::~string((string *)&local_298);
          goto LAB_003a4738;
        }
        bVar5 = cmSystemTools::IsPathToFramework((char *)0x3a4610);
        std::__cxx11::string::~string((string *)&local_298);
        if (!bVar5) goto LAB_003a4738;
        std::__cxx11::string::string((string *)&local_298,(string *)dir);
        std::__cxx11::string::append((char *)&local_298);
        cmsys::SystemTools::CollapseFullPath(&local_1c8,&local_298);
        std::__cxx11::string::operator=((string *)&local_298,(string *)&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        pVar14 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_278,&local_298);
        if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar12 = pcVar9;
          if (pcVar10 != (char *)0x0 && target != (cmGeneratorTarget *)0x0) {
            bVar5 = cmGeneratorTarget::IsSystemIncludeDirectory(target,dir,config);
            if (bVar5) {
              pcVar12 = pcVar10;
            }
          }
          std::operator<<(&local_1a8,pcVar12);
          cmOutputConverter::ConvertToOutputFormat
                    (&local_1c8,&this->super_cmOutputConverter,&local_298,(uint)forResponseFile * 2)
          ;
          poVar11 = std::operator<<(&local_1a8,(string *)&local_1c8);
          std::operator<<(poVar11," ");
          std::__cxx11::string::~string((string *)&local_1c8);
        }
        std::__cxx11::string::~string((string *)&local_298);
      }
    }
    std::__cxx11::stringbuf::str();
    if (((*pcVar13 != ' ') && (sVar2 = __return_storage_ptr__->_M_string_length, sVar2 != 0)) &&
       (pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar3[sVar2 - 1] == *pcVar13)) {
      pcVar3[sVar2 - 1] = ' ';
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  const std::vector<std::string>& includes, cmGeneratorTarget* target,
  const std::string& lang, bool forceFullPaths, bool forResponseFile,
  const std::string& config)
{
  if (lang.empty()) {
    return "";
  }

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  const char* includeFlag = this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (!sep) {
    sep = " ";
  } else {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = CM_NULLPTR;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
  }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag = this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  std::vector<std::string>::const_iterator i;
  for (i = includes.begin(); i != includes.end(); ++i) {
    if (fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i->c_str())) {
      std::string frameworkDir = *i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(*i, config)) {
          includeFlags << sysFwSearchFlag;
        } else {
          includeFlags << fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(*i, config)) {
        includeFlags << sysIncludeFlag;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath =
      this->ConvertToIncludeReference(*i, shellFormat, forceFullPaths);
    if (quotePaths && !includePath.empty() && includePath[0] != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath[0] != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags[flags.size() - 1] == sep[0]) {
    flags[flags.size() - 1] = ' ';
  }
  return flags;
}